

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.hpp
# Opt level: O0

void kitty::swap_adjacent_inplace<4u>(static_truth_table<4U,_true> *tt,uint8_t var_index)

{
  byte bVar1;
  uint64_t shift;
  uint8_t var_index_local;
  static_truth_table<4U,_true> *tt_local;
  
  bVar1 = (byte)(1L << (var_index & 0x3f));
  tt->_bits = tt->_bits & *(ulong *)(detail::permutation_masks + (ulong)var_index * 0x18) |
              (tt->_bits & *(ulong *)(detail::permutation_masks + (ulong)var_index * 0x18 + 8)) <<
              (bVar1 & 0x3f) |
              (tt->_bits & *(ulong *)(detail::permutation_masks + (ulong)var_index * 0x18 + 0x10))
              >> (bVar1 & 0x3f);
  return;
}

Assistant:

void swap_adjacent_inplace( static_truth_table<NumVars, true>& tt, uint8_t var_index )
{
  assert( var_index < tt.num_vars() );

  const auto shift = uint64_t( 1 ) << var_index;

  tt._bits = ( tt._bits & detail::permutation_masks[var_index][0] ) |
             ( ( tt._bits & detail::permutation_masks[var_index][1] ) << shift ) |
             ( ( tt._bits & detail::permutation_masks[var_index][2] ) >> shift );
}